

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

void __thiscall foxxll::request::error_occured(request *this,string *msg)

{
  io_error *piVar1;
  string *psVar2;
  
  psVar2 = (string *)operator_new(0x20);
  std::ios_base::failure[abi:cxx11]::failure(psVar2);
  *(undefined ***)psVar2 = &PTR__failure_001661a0;
  piVar1 = (this->error_)._M_t.
           super___uniq_ptr_impl<foxxll::io_error,_std::default_delete<foxxll::io_error>_>._M_t.
           super__Tuple_impl<0UL,_foxxll::io_error_*,_std::default_delete<foxxll::io_error>_>.
           super__Head_base<0UL,_foxxll::io_error_*,_false>._M_head_impl;
  (this->error_)._M_t.
  super___uniq_ptr_impl<foxxll::io_error,_std::default_delete<foxxll::io_error>_>._M_t.
  super__Tuple_impl<0UL,_foxxll::io_error_*,_std::default_delete<foxxll::io_error>_>.
  super__Head_base<0UL,_foxxll::io_error_*,_false>._M_head_impl = (io_error *)psVar2;
  if (piVar1 != (io_error *)0x0) {
    (**(code **)(*(long *)piVar1 + 8))();
    return;
  }
  return;
}

Assistant:

void request::error_occured(const std::string& msg)
{
    error_.reset(new io_error(msg));
}